

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slcand.c
# Opt level: O3

void child_handler(int signum)

{
  undefined1 uVar1;
  
  uVar1 = 1;
  switch(signum) {
  case 10:
    exit(0);
  case 0xb:
  case 0xc:
  case 0xd:
  case 0x10:
    return;
  case 0xe:
  case 0x11:
switchD_0010208a_caseD_e:
    (*syslogger)(5,"received signal %i on %s",signum,ttypath);
    slcand_running = 0;
    exit_code = uVar1;
    return;
  case 0xf:
    goto switchD_0010208a_caseD_f;
  default:
    if (signum != 2) {
      return;
    }
switchD_0010208a_caseD_f:
    uVar1 = 0;
    goto switchD_0010208a_caseD_e;
  }
}

Assistant:

static void child_handler(int signum)
{
	switch (signum) {

	case SIGUSR1:
		/* exit parent */
		exit(EXIT_SUCCESS);
		break;
	case SIGALRM:
	case SIGCHLD:
		syslogger(LOG_NOTICE, "received signal %i on %s", signum, ttypath);
		exit_code = EXIT_FAILURE;
		slcand_running = 0;
		break;
	case SIGINT:
	case SIGTERM:
		syslogger(LOG_NOTICE, "received signal %i on %s", signum, ttypath);
		exit_code = EXIT_SUCCESS;
		slcand_running = 0;
		break;
	}
}